

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFont * __thiscall
ImFontAtlas::AddFontFromFileTTF
          (ImFontAtlas *this,char *filename,float size_pixels,ImFontConfig *font_cfg_template,
          ImWchar *glyph_ranges)

{
  char *pcVar1;
  void *ttf_data;
  size_t sVar2;
  char *pcVar3;
  ImFont *pIVar4;
  long lVar5;
  ImFontConfig *pIVar6;
  byte bVar7;
  size_t data_size;
  ImFontConfig font_cfg;
  
  bVar7 = 0;
  data_size = 0;
  ttf_data = ImFileLoadToMemory(filename,"rb",&data_size,0);
  if (ttf_data == (void *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                  ,0x619,
                  "ImFont *ImFontAtlas::AddFontFromFileTTF(const char *, float, const ImFontConfig *, const ImWchar *)"
                 );
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    font_cfg.FontData = (void *)0x0;
    font_cfg.FontDataSize = 0;
    font_cfg.FontDataOwnedByAtlas = true;
    font_cfg.FontNo = 0;
    font_cfg.SizePixels = 0.0;
    font_cfg.OversampleH = 3;
    font_cfg.OversampleV = 1;
    font_cfg.PixelSnapH = false;
    font_cfg.GlyphRanges = (ImWchar *)0x0;
    font_cfg.MergeMode = false;
    font_cfg.RasterizerFlags = 0;
    font_cfg.RasterizerMultiply = 1.0;
    font_cfg.GlyphExtraSpacing.x = 0.0;
    font_cfg.GlyphExtraSpacing.y = 0.0;
    font_cfg.GlyphOffset.x = 0.0;
    font_cfg.GlyphOffset.y = 0.0;
    font_cfg.Name[0] = '\0';
    font_cfg.Name[1] = '\0';
    font_cfg.Name[2] = '\0';
    font_cfg.Name[3] = '\0';
    font_cfg.Name[4] = '\0';
    font_cfg.Name[5] = '\0';
    font_cfg.Name[6] = '\0';
    font_cfg.Name[7] = '\0';
    font_cfg.Name[8] = '\0';
    font_cfg.Name[9] = '\0';
    font_cfg.Name[10] = '\0';
    font_cfg.Name[0xb] = '\0';
    font_cfg.Name[0xc] = '\0';
    font_cfg.Name[0xd] = '\0';
    font_cfg.Name[0xe] = '\0';
    font_cfg.Name[0xf] = '\0';
    font_cfg.Name[0x20] = '\0';
    font_cfg.Name[0x21] = '\0';
    font_cfg.Name[0x22] = '\0';
    font_cfg.Name[0x23] = '\0';
    font_cfg.Name[0x24] = '\0';
    font_cfg.Name[0x25] = '\0';
    font_cfg.Name[0x26] = '\0';
    font_cfg.Name[0x27] = '\0';
    font_cfg.Name[0x10] = '\0';
    font_cfg.Name[0x11] = '\0';
    font_cfg.Name[0x12] = '\0';
    font_cfg.Name[0x13] = '\0';
    font_cfg.Name[0x14] = '\0';
    font_cfg.Name[0x15] = '\0';
    font_cfg.Name[0x16] = '\0';
    font_cfg.Name[0x17] = '\0';
    font_cfg.Name[0x18] = '\0';
    font_cfg.Name[0x19] = '\0';
    font_cfg.Name[0x1a] = '\0';
    font_cfg.Name[0x1b] = '\0';
    font_cfg.Name[0x1c] = '\0';
    font_cfg.Name[0x1d] = '\0';
    font_cfg.Name[0x1e] = '\0';
    font_cfg.Name[0x1f] = '\0';
    font_cfg.DstFont = (ImFont *)0x0;
  }
  else {
    pIVar6 = &font_cfg;
    for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
      pIVar6->FontData = font_cfg_template->FontData;
      font_cfg_template = (ImFontConfig *)((long)font_cfg_template + (ulong)bVar7 * -0x10 + 8);
      pIVar6 = (ImFontConfig *)((long)pIVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    if (font_cfg.Name[0] != '\0') goto LAB_001977c3;
  }
  sVar2 = strlen(filename);
  pcVar3 = filename + sVar2;
  do {
    if ((pcVar3 <= filename) || (pcVar1 = pcVar3 + -1, *pcVar1 == '\\')) break;
    pcVar3 = pcVar3 + -1;
  } while (*pcVar1 != '/');
  ImFormatString(font_cfg.Name,0x28,"%s, %.0fpx",SUB84((double)size_pixels,0));
LAB_001977c3:
  pIVar4 = AddFontFromMemoryTTF(this,ttf_data,(int)data_size,size_pixels,&font_cfg,glyph_ranges);
  return pIVar4;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromFileTTF(const char* filename, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    size_t data_size = 0;
    void* data = ImFileLoadToMemory(filename, "rb", &data_size, 0);
    if (!data)
    {
        IM_ASSERT(0); // Could not load file.
        return NULL;
    }
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    if (font_cfg.Name[0] == '\0')
    {
        // Store a short copy of filename into into the font name for convenience
        const char* p;
        for (p = filename + strlen(filename); p > filename && p[-1] != '/' && p[-1] != '\\'; p--) {}
        ImFormatString(font_cfg.Name, IM_ARRAYSIZE(font_cfg.Name), "%s, %.0fpx", p, size_pixels);
    }
    return AddFontFromMemoryTTF(data, (int)data_size, size_pixels, &font_cfg, glyph_ranges);
}